

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_PackBegin(stbtt_pack_context *spc,uchar *pixels,int pw,int ph,int stride_in_bytes,
                   int padding,void *alloc_context)

{
  int width;
  stbrp_context *context_00;
  stbrp_node *nodes_00;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  stbrp_node *nodes;
  int num_nodes;
  stbrp_context *context;
  int num_nodes_00;
  size_t in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int local_4;
  
  context_00 = (stbrp_context *)ImGui::MemAlloc(in_stack_ffffffffffffffc0);
  width = in_EDX - in_R9D;
  nodes_00 = (stbrp_node *)ImGui::MemAlloc(in_stack_ffffffffffffffc0);
  if ((context_00 == (stbrp_context *)0x0) || (nodes_00 == (stbrp_node *)0x0)) {
    if (context_00 != (stbrp_context *)0x0) {
      ImGui::MemFree(nodes_00);
    }
    if (nodes_00 != (stbrp_node *)0x0) {
      ImGui::MemFree(nodes_00);
    }
    local_4 = 0;
  }
  else {
    *in_RDI = nodes;
    *(int *)(in_RDI + 2) = in_EDX;
    *(int *)((long)in_RDI + 0x14) = in_ECX;
    in_RDI[6] = in_RSI;
    in_RDI[1] = context_00;
    in_RDI[7] = nodes_00;
    *(int *)((long)in_RDI + 0x1c) = in_R9D;
    num_nodes_00 = in_EDX;
    if (in_R8D != 0) {
      num_nodes_00 = in_R8D;
    }
    *(int *)(in_RDI + 3) = num_nodes_00;
    *(undefined4 *)((long)in_RDI + 0x24) = 1;
    *(undefined4 *)(in_RDI + 5) = 1;
    *(undefined4 *)(in_RDI + 4) = 0;
    stbrp_init_target(context_00,width,in_stack_ffffffffffffffc8,nodes_00,num_nodes_00);
    if (in_RSI != (void *)0x0) {
      memset(in_RSI,0,(long)(in_EDX * in_ECX));
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

STBTT_DEF int stbtt_PackBegin(stbtt_pack_context *spc, unsigned char *pixels, int pw, int ph, int stride_in_bytes, int padding, void *alloc_context)
{
   stbrp_context *context = (stbrp_context *) STBTT_malloc(sizeof(*context)            ,alloc_context);
   int            num_nodes = pw - padding;
   stbrp_node    *nodes   = (stbrp_node    *) STBTT_malloc(sizeof(*nodes  ) * num_nodes,alloc_context);

   if (context == NULL || nodes == NULL) {
      if (context != NULL) STBTT_free(context, alloc_context);
      if (nodes   != NULL) STBTT_free(nodes  , alloc_context);
      return 0;
   }

   spc->user_allocator_context = alloc_context;
   spc->width = pw;
   spc->height = ph;
   spc->pixels = pixels;
   spc->pack_info = context;
   spc->nodes = nodes;
   spc->padding = padding;
   spc->stride_in_bytes = stride_in_bytes != 0 ? stride_in_bytes : pw;
   spc->h_oversample = 1;
   spc->v_oversample = 1;
   spc->skip_missing = 0;

   stbrp_init_target(context, pw-padding, ph-padding, nodes, num_nodes);

   if (pixels)
      STBTT_memset(pixels, 0, pw*ph); // background of 0 around pixels

   return 1;
}